

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall llvm::FoldingSetNodeID::AddString(FoldingSetNodeID *this,StringRef String)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint *in_start;
  uint uVar6;
  int iVar7;
  uint Size;
  uint V;
  StringRef String_local;
  
  String_local.Length = String.Length;
  in_start = (uint *)String.Data;
  Size = (uint)String.Length;
  String_local.Data = (char *)in_start;
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&Size);
  uVar6 = Size;
  if (Size != 0) {
    if (((undefined1  [16])String & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
      SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
                ((SmallVectorImpl<unsigned_int> *)this,in_start,
                 (uint *)((ulong)(Size & 0xfffffffc) + (long)in_start));
      uVar6 = (uVar6 & 0xfffffffc) + 4;
    }
    else {
      for (uVar6 = 4; uVar6 <= Size; uVar6 = uVar6 + 4) {
        bVar1 = StringRef::operator[](&String_local,(ulong)(uVar6 - 1));
        bVar2 = StringRef::operator[](&String_local,(ulong)(uVar6 - 2));
        bVar3 = StringRef::operator[](&String_local,(ulong)(uVar6 - 3));
        bVar4 = StringRef::operator[](&String_local,(ulong)(uVar6 - 4));
        V = (uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18;
        SmallVectorTemplateBase<unsigned_int,_true>::push_back
                  ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&V);
      }
    }
    iVar7 = uVar6 - Size;
    uVar6 = 0;
    uVar5 = 0;
    if (iVar7 != 3) {
      if (iVar7 != 2) {
        if (iVar7 != 1) {
          return;
        }
        bVar1 = StringRef::operator[](&String_local,(ulong)(Size - 3));
        V = (uint)bVar1;
        uVar5 = (uint)bVar1 << 8;
      }
      bVar1 = StringRef::operator[](&String_local,(ulong)(Size - 2));
      uVar6 = (bVar1 | uVar5) << 8;
    }
    bVar1 = StringRef::operator[](&String_local,(ulong)(Size - 1));
    V = bVar1 | uVar6;
    SmallVectorTemplateBase<unsigned_int,_true>::push_back
              ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&V);
  }
  return;
}

Assistant:

void FoldingSetNodeID::AddString(StringRef String) {
  unsigned Size =  String.size();
  Bits.push_back(Size);
  if (!Size) return;

  unsigned Units = Size / 4;
  unsigned Pos = 0;
  const unsigned *Base = (const unsigned*) String.data();

  // If the string is aligned do a bulk transfer.
  if (!((intptr_t)Base & 3)) {
    Bits.append(Base, Base + Units);
    Pos = (Units + 1) * 4;
  } else {
    // Otherwise do it the hard way.
    // To be compatible with above bulk transfer, we need to take endianness
    // into account.
    static_assert(sys::IsBigEndianHost || sys::IsLittleEndianHost,
                  "Unexpected host endianness");
    if (sys::IsBigEndianHost) {
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 4] << 24) |
                     ((unsigned char)String[Pos - 3] << 16) |
                     ((unsigned char)String[Pos - 2] << 8) |
                      (unsigned char)String[Pos - 1];
        Bits.push_back(V);
      }
    } else {  // Little-endian host
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 1] << 24) |
                     ((unsigned char)String[Pos - 2] << 16) |
                     ((unsigned char)String[Pos - 3] << 8) |
                      (unsigned char)String[Pos - 4];
        Bits.push_back(V);
      }
    }
  }

  // With the leftover bits.
  unsigned V = 0;
  // Pos will have overshot size by 4 - #bytes left over.
  // No need to take endianness into account here - this is always executed.
  switch (Pos - Size) {
  case 1: V = (V << 8) | (unsigned char)String[Size - 3]; LLVM_FALLTHROUGH;
  case 2: V = (V << 8) | (unsigned char)String[Size - 2]; LLVM_FALLTHROUGH;
  case 3: V = (V << 8) | (unsigned char)String[Size - 1]; break;
  default: return; // Nothing left.
  }

  Bits.push_back(V);
}